

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O3

int tls_prf_sha256(uchar *secret,size_t slen,char *label,uchar *random,size_t rlen,uchar *dstbuf,
                  size_t dlen)

{
  ulong uVar1;
  byte bVar2;
  int iVar3;
  mbedtls_md_info_t *md_info;
  size_t __n;
  uchar *output;
  ulong __n_00;
  ulong uVar4;
  ulong ilen;
  uchar *input;
  void *ilen_00;
  uchar local_a8 [8];
  uchar h_i [32];
  undefined1 local_60 [8];
  mbedtls_md_context_t md_ctx;
  
  h_i._24_8_ = random;
  mbedtls_md_init((mbedtls_md_context_t *)local_60);
  md_info = mbedtls_md_info_from_type(MBEDTLS_MD_SHA256);
  if (md_info == (mbedtls_md_info_t *)0x0) {
    iVar3 = -0x6c00;
  }
  else {
    bVar2 = mbedtls_md_get_size(md_info);
    ilen = (ulong)bVar2;
    __n = strlen(label);
    md_ctx.hmac_ctx = (void *)(__n + rlen + ilen);
    output = (uchar *)calloc(1,(size_t)md_ctx.hmac_ctx);
    if (output == (uchar *)0x0) {
      mbedtls_md_free((mbedtls_md_context_t *)local_60);
      iVar3 = -0x7f00;
    }
    else {
      input = output + ilen;
      memcpy(input,label,__n);
      memcpy(input + __n,(void *)h_i._24_8_,rlen);
      iVar3 = mbedtls_md_setup((mbedtls_md_context_t *)local_60,md_info,1);
      ilen_00 = md_ctx.hmac_ctx;
      if ((((iVar3 == 0) &&
           (iVar3 = mbedtls_md_hmac_starts((mbedtls_md_context_t *)local_60,secret,slen),
           ilen_00 = md_ctx.hmac_ctx, iVar3 == 0)) &&
          (iVar3 = mbedtls_md_hmac_update((mbedtls_md_context_t *)local_60,input,__n + rlen),
          iVar3 == 0)) &&
         (iVar3 = mbedtls_md_hmac_finish((mbedtls_md_context_t *)local_60,output), iVar3 == 0)) {
        if (dlen == 0) {
          iVar3 = 0;
        }
        else {
          uVar4 = 0;
          do {
            iVar3 = mbedtls_md_hmac_reset((mbedtls_md_context_t *)local_60);
            if ((((iVar3 != 0) ||
                 (iVar3 = mbedtls_md_hmac_update
                                    ((mbedtls_md_context_t *)local_60,output,(size_t)ilen_00),
                 iVar3 != 0)) ||
                ((iVar3 = mbedtls_md_hmac_finish((mbedtls_md_context_t *)local_60,local_a8),
                 iVar3 != 0 ||
                 ((iVar3 = mbedtls_md_hmac_reset((mbedtls_md_context_t *)local_60), iVar3 != 0 ||
                  (iVar3 = mbedtls_md_hmac_update((mbedtls_md_context_t *)local_60,output,ilen),
                  iVar3 != 0)))))) ||
               (iVar3 = mbedtls_md_hmac_finish((mbedtls_md_context_t *)local_60,output), iVar3 != 0)
               ) break;
            uVar1 = uVar4 + ilen;
            __n_00 = ilen;
            if (dlen < uVar1) {
              __n_00 = dlen % ilen;
            }
            if (__n_00 != 0) {
              memcpy(dstbuf + uVar4,local_a8,__n_00);
            }
            iVar3 = 0;
            uVar4 = uVar1;
          } while (uVar1 < dlen);
        }
      }
      mbedtls_md_free((mbedtls_md_context_t *)local_60);
      mbedtls_platform_zeroize(output,(size_t)ilen_00);
    }
    mbedtls_platform_zeroize(local_a8,0x20);
    free(output);
  }
  return iVar3;
}

Assistant:

MBEDTLS_CHECK_RETURN_CRITICAL
static int tls_prf_sha256(const unsigned char *secret, size_t slen,
                          const char *label,
                          const unsigned char *random, size_t rlen,
                          unsigned char *dstbuf, size_t dlen)
{
    return tls_prf_generic(MBEDTLS_MD_SHA256, secret, slen,
                           label, random, rlen, dstbuf, dlen);
}